

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O1

void __thiscall QThreadPool::setServiceLevel(QThreadPool *this,QualityOfService serviceLevel)

{
  qsizetype *this_00;
  qsizetype *pqVar1;
  long lVar2;
  void *copy;
  QObjectData *pQVar3;
  
  pQVar3 = (this->super_QObject).d_ptr.d;
  this_00 = &pQVar3[1].children.d.size;
  if (pQVar3[1].children.d.size == 0) {
    LOCK();
    lVar2 = *this_00;
    if (lVar2 == 0) {
      *this_00 = 1;
    }
    UNLOCK();
    if (lVar2 == 0) goto LAB_003d49bf;
  }
  QBasicMutex::lockInternal((QBasicMutex *)this_00);
LAB_003d49bf:
  *(QualityOfService *)&pQVar3[3].children.d.d = serviceLevel;
  LOCK();
  pqVar1 = &pQVar3[1].children.d.size;
  copy = (void *)*pqVar1;
  *pqVar1 = 0;
  UNLOCK();
  if (copy != (void *)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
    return;
  }
  return;
}

Assistant:

void QThreadPool::setServiceLevel(QThread::QualityOfService serviceLevel)
{
    Q_D(QThreadPool);
    QMutexLocker locker(&d->mutex);
    d->serviceLevel = serviceLevel;
}